

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O0

void refreshDisplay(void)

{
  byte *pbVar1;
  byte local_21;
  int local_20;
  int iStack_1c;
  uint8_t b;
  int x;
  int y;
  uint8_t *dst;
  uint8_t *src;
  
  if (refreshDisplay::surface_handle == -1) {
    refreshDisplay::surface_handle = open("/dev/fb0",2);
    refreshDisplay::surface_buffer =
         (uint8_t *)mmap((void *)0x0,0x2000,3,1,refreshDisplay::surface_handle,0);
  }
  dst = jedi_screen_buffer;
  _x = refreshDisplay::surface_buffer;
  for (iStack_1c = 0; iStack_1c < 0x40; iStack_1c = iStack_1c + 1) {
    for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
      local_21 = 0x80 < *dst;
      if (0x80 < dst[1]) {
        local_21 = local_21 | 2;
      }
      if (0x80 < dst[2]) {
        local_21 = local_21 | 4;
      }
      if (0x80 < dst[3]) {
        local_21 = local_21 | 8;
      }
      if (0x80 < dst[4]) {
        local_21 = local_21 | 0x10;
      }
      if (0x80 < dst[5]) {
        local_21 = local_21 | 0x20;
      }
      pbVar1 = dst + 7;
      if (0x80 < dst[6]) {
        local_21 = local_21 | 0x40;
      }
      dst = dst + 8;
      if (0x80 < *pbVar1) {
        local_21 = local_21 | 0x80;
      }
      *_x = local_21;
      _x = _x + 1;
    }
  }
  return;
}

Assistant:

static void refreshDisplay()
{
#ifdef USE_SDL
    SDL_Surface* screen = SDL_GetVideoSurface();
#ifdef DEBUG
    for(int x=0; x<NUMCOLS; x++)
    {
        for(int y=0; y<NUMLINES; y++)
        {
            int c = char_at_place(x, y);
            
            for(int _x=0; _x<4; _x++)
            {
                for(int _y=0; _y<6; _y++)
                {
                    int color = (font_data[c * 6 + _y] & (0x08>>_x)) ? 0x8080AF : 0x202020;
                    if (!(flags_at(x, y) & F_SEEN))
                        color /= 2;
                    SDL_Rect rect = {Sint16(128 * 5 + x * 4 * 2 + _x * 2), Sint16(y * 6 * 2 + _y * 2), 2, 2};
                    SDL_FillRect(screen, &rect, color);
                }
            }
        }
    }
#endif
    for(int x=0; x<DISPLAY_WIDTH; x++)
    {
        for(int y=0; y<DISPLAY_HEIGHT; y++)
        {
            int color = jedi_screen_buffer[x + y * DISPLAY_WIDTH] > 128 ? 0x8080AF : 0x202020;
            SDL_Rect rect = {Sint16(x * 5), Sint16(y * 5), 4, 4};
            SDL_FillRect(screen, &rect, color);
        }
    }
    SDL_Flip(screen);
#else
    static int surface_handle = -1;
    static uint8_t* surface_buffer;
    if (surface_handle == -1)
    {
        surface_handle = open("/dev/fb0", O_RDWR);
        surface_buffer = (uint8_t*)mmap(nullptr, DISPLAY_WIDTH * DISPLAY_HEIGHT, PROT_READ | PROT_WRITE, MAP_SHARED, surface_handle, 0);
    }

    uint8_t* src = jedi_screen_buffer;
    uint8_t* dst = surface_buffer;
    for(int y=0; y<DISPLAY_HEIGHT; y++)
    {
        for(int x=0; x<DISPLAY_WIDTH/8; x++)
        {
            uint8_t b = 0;
            if (*src++ > 128) b |= 0x01;
            if (*src++ > 128) b |= 0x02;
            if (*src++ > 128) b |= 0x04;
            if (*src++ > 128) b |= 0x08;
            if (*src++ > 128) b |= 0x10;
            if (*src++ > 128) b |= 0x20;
            if (*src++ > 128) b |= 0x40;
            if (*src++ > 128) b |= 0x80;
            *dst++ = b;
        }
    }
#endif
}